

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

int iniparser_getboolean(dictionary *d,char *key,int notfound)

{
  char cVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char ch;
  char *c;
  int ret;
  int notfound_local;
  char *key_local;
  dictionary *d_local;
  
  __s = iniparser_getstring(d,key,(char *)0xffffffffffffffff);
  d_local._4_4_ = notfound;
  if ((__s != (char *)0x0) && (__s != (char *)0xffffffffffffffff)) {
    iVar2 = tolower((int)*__s);
    cVar1 = (char)iVar2;
    if ((cVar1 == 'y') || ((cVar1 == 't' || (cVar1 == '1')))) {
      c._0_4_ = 1;
    }
    else if (((cVar1 == 'n') || (cVar1 == 'f')) || (cVar1 == '0')) {
      c._0_4_ = 0;
    }
    else {
      c._0_4_ = notfound;
      if (cVar1 == 'o') {
        iVar2 = tolower((int)__s[1]);
        if (iVar2 == 0x6e) {
          c._0_4_ = 1;
        }
        else {
          sVar3 = strlen(__s);
          if (((2 < sVar3) && (iVar2 = tolower((int)__s[1]), iVar2 == 0x66)) &&
             (iVar2 = tolower((int)__s[2]), iVar2 == 0x66)) {
            c._0_4_ = 0;
          }
        }
      }
    }
    d_local._4_4_ = (int)c;
  }
  return d_local._4_4_;
}

Assistant:

int iniparser_getboolean(const dictionary * d, const char * key, int notfound)
{
    int          ret = notfound;
    const char * c ;
    char         ch;

    c = iniparser_getstring(d, key, INI_INVALID_KEY);
    if (c==NULL || c==INI_INVALID_KEY) return notfound ;
    ch = tolower(c[0]);
    if (ch=='y' || ch=='t' || ch=='1') {
        ret = 1 ;
    } else if (ch=='n' || ch=='f' || ch=='0') {
        ret = 0 ;
    } else {
        /* allow 'on' and 'off' */
        if (ch=='o') {
            /* strings are null-terminated so c[1] exists at this point */
            if (tolower(c[1])=='n') {
                ret = 1;
            } else if (strlen(c)>2) {
                if (tolower(c[1])=='f' && tolower(c[2])=='f') {
                  ret =0;
               }
            }
        }
    }
    return ret;
}